

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLoggerMgr::flushCriticalInfo(SimpleLoggerMgr *this)

{
  byte bVar1;
  ulong uVar2;
  ostream *this_00;
  void *this_01;
  long in_RDI;
  string msg;
  char *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  string local_a0 [24];
  unsigned_long in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  SimpleLoggerMgr *in_stack_ffffffffffffffb0;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28," === Critical info (given by user): ",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::__cxx11::string::size();
  std::__cxx11::to_string(in_stack_ffffffffffffff78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff40);
  std::__cxx11::string::operator+=(local_28,(string *)&stack0xffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::__cxx11::string::operator+=(local_28," ===");
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::__cxx11::string::operator+=(local_28,local_a0);
    std::__cxx11::string::~string(local_a0);
  }
  flushAllLoggers(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) != 0) {
    this_00 = std::operator<<((ostream *)(in_RDI + 0x228),local_28);
    this_01 = (void *)std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void SimpleLoggerMgr::flushCriticalInfo() {
    std::string msg = " === Critical info (given by user): ";
    msg += std::to_string(globalCriticalInfo.size()) + " bytes";
    msg += " ===";
    if (!globalCriticalInfo.empty()) {
        msg += "\n" + globalCriticalInfo;
    }
    flushAllLoggers(2, msg);
    if (crashDumpFile.is_open()) {
        crashDumpFile << msg << std::endl << std::endl;
    }
}